

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

UDate __thiscall icu_63::DateFormat::parse(DateFormat *this,UnicodeString *text,ParsePosition *pos)

{
  int iVar1;
  undefined4 extraout_var;
  UDate UVar2;
  UErrorCode ec;
  UErrorCode local_2c;
  Calendar *this_00;
  
  UVar2 = 0.0;
  if (this->fCalendar != (Calendar *)0x0) {
    iVar1 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
    UVar2 = 0.0;
    if (this_00 != (Calendar *)0x0) {
      iVar1 = pos->index;
      Calendar::clear(this_00);
      (*(this->super_Format).super_UObject._vptr_UObject[0xb])(this,text,this_00,pos);
      UVar2 = 0.0;
      if (pos->index != iVar1) {
        local_2c = U_ZERO_ERROR;
        UVar2 = Calendar::getTimeInMillis(this_00,&local_2c);
        if (U_ZERO_ERROR < local_2c) {
          pos->index = iVar1;
          pos->errorIndex = iVar1;
          UVar2 = 0.0;
        }
      }
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
  }
  return UVar2;
}

Assistant:

UDate
DateFormat::parse(const UnicodeString& text,
                  ParsePosition& pos) const
{
    UDate d = 0; // Error return UDate is 0 (the epoch)
    if (fCalendar != NULL) {
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            int32_t start = pos.getIndex();
            calClone->clear();
            parse(text, *calClone, pos);
            if (pos.getIndex() != start) {
                UErrorCode ec = U_ZERO_ERROR;
                d = calClone->getTime(ec);
                if (U_FAILURE(ec)) {
                    // We arrive here if fCalendar => calClone is non-lenient and
                    // there is an out-of-range field.  We don't know which field
                    // was illegal so we set the error index to the start.
                    pos.setIndex(start);
                    pos.setErrorIndex(start);
                    d = 0;
                }
            }
            delete calClone;
        }
    }
    return d;
}